

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O0

void __thiscall
solitaire::SolitaireHandWithOneCardAddCardTest_tryAddCardOnFoundationPileWithFail_Test::TestBody
          (SolitaireHandWithOneCardAddCardTest_tryAddCardOnFoundationPileWithFail_Test *this)

{
  PileId *this_00;
  bool bVar1;
  FoundationPileMock *pFVar2;
  MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  *this_01;
  MockSpec<void_(std::optional<solitaire::cards::Card>_&)> *this_02;
  char *message;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  *matcher;
  AssertHelper local_d8;
  Message local_d0;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  local_c8;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
  local_b0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  WithoutMatchers local_7d [13];
  Matcher<std::optional<solitaire::cards::Card>_&> local_70;
  MockSpec<void_(std::optional<solitaire::cards::Card>_&)> local_58;
  WithoutMatchers local_31;
  MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  local_30;
  undefined1 local_1c [8];
  optional<solitaire::cards::Card> cardToAdd;
  SolitaireHandWithOneCardAddCardTest_tryAddCardOnFoundationPileWithFail_Test *this_local;
  
  cardToAdd.super__Optional_base<solitaire::cards::Card,_true,_true>._M_payload.
  super__Optional_payload_base<solitaire::cards::Card>._4_8_ = this;
  pFVar2 = (FoundationPileMock *)
           std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::back
                     ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
                      (anonymous_namespace)::oneCard);
  std::optional<solitaire::cards::Card>::optional<const_solitaire::cards::Card_&,_true>
            ((optional<solitaire::cards::Card> *)local_1c,(Card *)pFVar2);
  local_30.function_mocker_ =
       (FunctionMocker<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
        *)piles::FoundationPileMock::gmock_createSnapshot
                    ((MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
                      *)(this->super_SolitaireHandWithOneCardAddCardTest).
                        super_SolitaireHandWithOneCardTest.super_SolitaireEmptyHandTest.
                        super_SolitaireTest.lastFoundationPileMock,pFVar2);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
            ::operator()(&local_30,&local_31,(void *)0x0);
  testing::internal::
  MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  ::InternalExpectedAt
            (this_01,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
             ,0x1d5,"lastFoundationPileMock","createSnapshot()");
  pFVar2 = (this->super_SolitaireHandWithOneCardAddCardTest).super_SolitaireHandWithOneCardTest.
           super_SolitaireEmptyHandTest.super_SolitaireTest.lastFoundationPileMock;
  testing::Matcher<std::optional<solitaire::cards::Card>_&>::Matcher
            (&local_70,(optional<solitaire::cards::Card> *)local_1c);
  piles::FoundationPileMock::gmock_tryAddCard(&local_58,pFVar2,&local_70);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<void_(std::optional<solitaire::cards::Card>_&)>::operator()
                      (&local_58,local_7d,(void *)0x0);
  testing::internal::MockSpec<void_(std::optional<solitaire::cards::Card>_&)>::InternalExpectedAt
            (this_02,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
             ,0x1d6,"lastFoundationPileMock","tryAddCard(cardToAdd)");
  testing::internal::MockSpec<void_(std::optional<solitaire::cards::Card>_&)>::~MockSpec(&local_58);
  testing::Matcher<std::optional<solitaire::cards::Card>_&>::~Matcher(&local_70);
  this_00 = (PileId *)
            ((long)&gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 4);
  piles::PileId::PileId(this_00,(PileId *)&(anonymous_namespace)::lastFoundationPileId);
  Solitaire::tryAddCardOnFoundationPile
            (&(this->super_SolitaireHandWithOneCardAddCardTest).super_SolitaireHandWithOneCardTest.
              super_SolitaireEmptyHandTest.super_SolitaireTest.solitaire,this_00);
  testing::ContainerEq<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
            (&local_c8,(testing *)(anonymous_namespace)::oneCard,rhs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
            (&local_b0,(internal *)&local_c8,matcher);
  Solitaire::getCardsInHand
            (&(this->super_SolitaireHandWithOneCardAddCardTest).super_SolitaireHandWithOneCardTest.
              super_SolitaireEmptyHandTest.super_SolitaireTest.solitaire);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(local_98,(char *)&local_b0,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "solitaire.getCardsInHand()");
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_b0);
  testing::
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  ::~PolymorphicMatcher(&local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
               ,0x1d9,message);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  return;
}

Assistant:

TEST_F(SolitaireHandWithOneCardAddCardTest, tryAddCardOnFoundationPileWithFail) {
    std::optional<Card> cardToAdd {oneCard.back()};

    EXPECT_CALL(lastFoundationPileMock, createSnapshot());
    EXPECT_CALL(lastFoundationPileMock, tryAddCard(cardToAdd));

    solitaire.tryAddCardOnFoundationPile(lastFoundationPileId);
    EXPECT_THAT(solitaire.getCardsInHand(), ContainerEq(oneCard));
}